

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::SamHeaderValidator::ValidateSequenceDictionary(SamHeaderValidator *this)

{
  bool bVar1;
  bool bVar2;
  SamSequenceConstIterator seq_00;
  SamSequenceConstIterator SVar3;
  SamSequence *seq;
  SamSequenceDictionary *this_00;
  
  bVar1 = ContainsUniqueSequenceNames(this);
  this_00 = &this->m_header->Sequences;
  seq_00 = SamSequenceDictionary::ConstBegin(this_00);
  SVar3 = SamSequenceDictionary::ConstEnd(this_00);
  for (; seq_00._M_current != SVar3._M_current; seq_00._M_current = seq_00._M_current + 1) {
    bVar2 = ValidateSequence(this,seq_00._M_current);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  return bVar1;
}

Assistant:

bool SamHeaderValidator::ValidateSequenceDictionary()
{

    bool isValid = true;

    // check for unique sequence names
    isValid &= ContainsUniqueSequenceNames();

    // iterate over sequences
    const SamSequenceDictionary& sequences = m_header.Sequences;
    SamSequenceConstIterator seqIter = sequences.ConstBegin();
    SamSequenceConstIterator seqEnd = sequences.ConstEnd();
    for (; seqIter != seqEnd; ++seqIter) {
        const SamSequence& seq = (*seqIter);
        isValid &= ValidateSequence(seq);
    }

    // return validation state
    return isValid;
}